

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

bool __thiscall DMessageBoxMenu::MouseEvent(DMessageBoxMenu *this,int type,int x,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint local_28;
  int fh;
  int sel;
  int y_local;
  int x_local;
  int type_local;
  DMessageBoxMenu *this_local;
  
  if (this->mMessageMode == 1) {
    if (type == 0) {
      iVar1 = (*(this->super_DMenu).super_DObject._vptr_DObject[8])(this,6,1);
      this_local._7_1_ = (bool)((byte)iVar1 & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    local_28 = 0xffffffff;
    iVar1 = FFont::GetHeight(SmallFont);
    iVar2 = DCanvas::GetWidth((DCanvas *)screen);
    iVar2 = (x - iVar2 / 2) / CleanXfac + 0xa0;
    iVar3 = DCanvas::GetHeight((DCanvas *)screen);
    iVar3 = (y - iVar3 / 2) / CleanYfac + 100;
    if ((((this->mMouseLeft <= iVar2) && (iVar2 <= this->mMouseRight)) && (this->mMouseY <= iVar3))
       && (iVar3 < this->mMouseY + (iVar1 + 1) * 2)) {
      local_28 = (uint)(this->mMouseY + iVar1 + 1 <= iVar3);
    }
    this->messageSelection = local_28;
    if (type == 2) {
      iVar1 = (*(this->super_DMenu).super_DObject._vptr_DObject[8])(this,6,1);
      this_local._7_1_ = (bool)((byte)iVar1 & 1);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DMessageBoxMenu::MouseEvent(int type, int x, int y)
{
	if (mMessageMode == 1)
	{
		if (type == MOUSE_Click)
		{
			return MenuEvent(MKEY_Enter, true);
		}
		return false;
	}
	else
	{
		int sel = -1;
		int fh = SmallFont->GetHeight() + 1;

		// convert x/y from screen to virtual coordinates, according to CleanX/Yfac use in DrawTexture
		x = ((x - (screen->GetWidth() / 2)) / CleanXfac) + 160;
		y = ((y - (screen->GetHeight() / 2)) / CleanYfac) + 100;

		if (x >= mMouseLeft && x <= mMouseRight && y >= mMouseY && y < mMouseY + 2 * fh)
		{
			sel = y >= mMouseY + fh;
		}
		if (sel != -1 && sel != messageSelection)
		{
			//S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
		}
		messageSelection = sel;
		if (type == MOUSE_Release)
		{
			return MenuEvent(MKEY_Enter, true);
		}
		return true;
	}
}